

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity_script.cxx
# Opt level: O1

void __thiscall xray_re::se_respawn::state_read(se_respawn *this,xr_packet *packet,uint16_t size)

{
  ushort uVar1;
  size_t sVar2;
  uchar value;
  byte local_29;
  
  cse_alife_smart_zone::state_read(&this->super_cse_alife_smart_zone,packet,size);
  uVar1 = (this->super_cse_alife_smart_zone).super_cse_alife_space_restrictor.
          super_cse_alife_dynamic_object.super_cse_alife_object.super_cse_abstract.m_version;
  if (uVar1 < 0x68) {
    if (uVar1 != 0x65) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                    ,0x1a6,"virtual void xray_re::se_respawn::state_read(xr_packet &, uint16_t)");
    }
  }
  else {
    xr_packet::r_raw(packet,&local_29,1);
    sVar2 = packet->m_r_pos;
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::reserve
              (&this->m_spawned_obj,(ulong)local_29);
    std::vector<unsigned_short,std::allocator<unsigned_short>>::_M_assign_aux<unsigned_short_const*>
              ((vector<unsigned_short,std::allocator<unsigned_short>> *)&this->m_spawned_obj,
               packet->m_buf + sVar2,packet->m_buf + (uint)local_29 * 2 + sVar2);
    packet->m_r_pos = packet->m_r_pos + (ulong)((uint)local_29 * 2);
  }
  return;
}

Assistant:

void se_respawn::state_read(xr_packet& packet, uint16_t size)
{
	cse_alife_smart_zone::state_read(packet, size);
    if (m_version >= CSE_VERSION_2232) {
		packet.r_seq(packet.r_u8(), m_spawned_obj);
	} else if (m_version == CSE_VERSION_2215) {
		// there is no se_respawn in 2215 so we should not ever get here.
	} else {
		xr_not_implemented();
	}
}